

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::Mesh::reduce_array<signed_char>
          (Mesh *this,Int ent_dim,Read<signed_char> *a,Int width,Omega_h_Op op)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  undefined4 in_register_00000034;
  Read<signed_char> RVar3;
  Write<signed_char> local_d0;
  Dist local_c0;
  
  bVar1 = could_be_shared((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
  if (bVar1) {
    ask_dist(&local_c0,(Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
    Write<signed_char>::Write(&local_d0,(Write<signed_char> *)CONCAT44(in_register_0000000c,width));
    Dist::exch_reduce<signed_char>((Dist *)this,(Read<signed_char> *)&local_c0,(Int)&local_d0,op);
    Write<signed_char>::~Write(&local_d0);
    Dist::~Dist(&local_c0);
    pvVar2 = extraout_RDX;
  }
  else {
    Write<signed_char>::Write
              ((Write<signed_char> *)this,(Write<signed_char> *)CONCAT44(in_register_0000000c,width)
              );
    pvVar2 = extraout_RDX_00;
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<T> Mesh::reduce_array(Int ent_dim, Read<T> a, Int width, Omega_h_Op op) {
  if (!could_be_shared(ent_dim)) return a;
  return ask_dist(ent_dim).exch_reduce(a, width, op);
}